

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerGLSL::attempt_emit_loop_header
          (CompilerGLSL *this,SPIRBlock *block,Method method)

{
  uint32_t uVar1;
  uint uVar2;
  size_t sVar3;
  TypedID<(spirv_cross::Types)2> *pTVar4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  bool bVar7;
  ContinueBlockType CVar8;
  SPIRBlock *pSVar9;
  CompilerGLSL *pCVar10;
  SPIRBlock *pSVar11;
  __hash_code __code;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  ulong uVar13;
  BlockID to;
  __node_base_ptr p_Var14;
  __node_base_ptr p_Var15;
  long lVar16;
  bool bVar17;
  string initializer;
  string continue_block;
  string condition;
  string local_50;
  
  pSVar9 = Variant::get<spirv_cross::SPIRBlock>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (block->continue_block).id);
  CVar8 = Compiler::continue_block_type(&this->super_Compiler,pSVar9);
  if ((method & ~MergeToSelectContinueForLoop) == MergeToSelectForLoop) {
    uVar1 = this->statement_count;
    bVar17 = this->block_debug_directives;
    this->block_debug_directives = true;
    emit_block_instructions(this,block);
    this->block_debug_directives = bVar17;
    uVar2 = (block->condition).id;
    uVar5 = (this->super_Compiler).forced_temporaries._M_h._M_bucket_count;
    uVar13 = (ulong)uVar2 % uVar5;
    p_Var14 = (this->super_Compiler).forced_temporaries._M_h._M_buckets[uVar13];
    p_Var15 = (__node_base_ptr)0x0;
    if ((p_Var14 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var14->_M_nxt, p_Var15 = p_Var14, uVar2 != *(uint *)&p_Var14->_M_nxt[1]._M_nxt))
    {
      while (p_Var14 = p_Var6, p_Var6 = p_Var14->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        p_Var15 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var6[1]._M_nxt % uVar5 != uVar13) ||
           (p_Var15 = p_Var14, uVar2 == *(uint *)&p_Var6[1]._M_nxt)) goto LAB_002984c6;
      }
      p_Var15 = (__node_base_ptr)0x0;
    }
LAB_002984c6:
    if (p_Var15 == (__node_base_ptr)0x0) {
      bVar17 = false;
    }
    else {
      bVar17 = p_Var15->_M_nxt != (_Hash_node_base *)0x0;
    }
    bVar7 = Compiler::flush_phi_required
                      (&this->super_Compiler,(BlockID)(block->super_IVariant).self.id,
                       (BlockID)(block->true_block).id);
    if ((bVar7) ||
       (bVar7 = Compiler::flush_phi_required
                          (&this->super_Compiler,(BlockID)(block->super_IVariant).self.id,
                           (BlockID)(block->false_block).id),
       (bVar17 || bVar7) || uVar1 != this->statement_count)) goto LAB_00298828;
    if (CVar8 == WhileLoop) {
      sVar3 = (block->dominated_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
      if (sVar3 != 0) {
        pTVar4 = (block->dominated_variables).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
        lVar16 = 0;
        do {
          flush_variable_declaration(this,*(uint32_t *)((long)&pTVar4->id + lVar16));
          lVar16 = lVar16 + 4;
        } while (sVar3 << 2 != lVar16);
      }
      emit_while_loop_initializers(this,block);
      (*(this->super_Compiler)._vptr_Compiler[0x38])(this,block);
      pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
      to_expression_abi_cxx11_(&initializer,this,(block->condition).id,true);
      pCVar10 = (CompilerGLSL *)
                Variant::get<spirv_cross::SPIRBlock>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + (block->true_block).id);
      pSVar9 = Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (block->merge_block).id);
      bVar17 = Compiler::execution_is_noop(&this->super_Compiler,(SPIRBlock *)pCVar10,pSVar9);
      if (bVar17) {
        enclose_expression(&continue_block,pCVar10,&initializer);
        join<char_const(&)[2],std::__cxx11::string>
                  (&condition,(spirv_cross *)0x3053c7,(char (*) [2])&continue_block,pbVar12);
        ::std::__cxx11::string::operator=((string *)&initializer,(string *)&condition);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)condition._M_dataplus._M_p != &condition.field_2) {
          operator_delete(condition._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)continue_block._M_dataplus._M_p != &continue_block.field_2) {
          operator_delete(continue_block._M_dataplus._M_p);
        }
      }
      statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
                (this,(char (*) [8])"while (",&initializer,(char (*) [2])0x314a82);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)initializer._M_dataplus._M_p == &initializer.field_2) goto LAB_00298b35;
    }
    else {
      if (CVar8 != ForLoop) goto LAB_00298828;
      sVar3 = (block->dominated_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
      if (sVar3 != 0) {
        pTVar4 = (block->dominated_variables).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
        lVar16 = 0;
        do {
          flush_variable_declaration(this,*(uint32_t *)((long)&pTVar4->id + lVar16));
          lVar16 = lVar16 + 4;
        } while (sVar3 << 2 != lVar16);
      }
      emit_for_loop_initializers_abi_cxx11_(&initializer,this,block);
      pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
      to_expression_abi_cxx11_(&condition,this,(block->condition).id,true);
      pCVar10 = (CompilerGLSL *)
                Variant::get<spirv_cross::SPIRBlock>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + (block->true_block).id);
      pSVar9 = Variant::get<spirv_cross::SPIRBlock>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (block->merge_block).id);
      bVar17 = Compiler::execution_is_noop(&this->super_Compiler,(SPIRBlock *)pCVar10,pSVar9);
      if (bVar17) {
        enclose_expression(&local_50,pCVar10,&condition);
        join<char_const(&)[2],std::__cxx11::string>
                  (&continue_block,(spirv_cross *)0x3053c7,(char (*) [2])&local_50,pbVar12);
        ::std::__cxx11::string::operator=((string *)&condition,(string *)&continue_block);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)continue_block._M_dataplus._M_p != &continue_block.field_2) {
          operator_delete(continue_block._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      (*(this->super_Compiler)._vptr_Compiler[0x38])(this,block);
      if (method == MergeToSelectContinueForLoop) {
        statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[4]>
                  (this,(char (*) [6])"for (",&initializer,(char (*) [3])0x2f514f,&condition,
                   (char (*) [4])"; )");
      }
      else {
        emit_continue_block_abi_cxx11_(&continue_block,this,(block->continue_block).id,false,false);
        statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                  (this,(char (*) [6])"for (",&initializer,(char (*) [3])0x2f514f,&condition,
                   (char (*) [3])0x2f514f,&continue_block,(char (*) [2])0x314a82);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)continue_block._M_dataplus._M_p != &continue_block.field_2) {
          operator_delete(continue_block._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)condition._M_dataplus._M_p != &condition.field_2) {
        operator_delete(condition._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)initializer._M_dataplus._M_p == &initializer.field_2) goto LAB_00298b35;
    }
    operator_delete(initializer._M_dataplus._M_p);
LAB_00298b35:
    statement<char_const(&)[2]>(this,(char (*) [2])0x2f5d0c);
    this->indent = this->indent + 1;
    return true;
  }
  if (method != MergeToDirectForLoop) {
    return false;
  }
  pSVar9 = Variant::get<spirv_cross::SPIRBlock>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (block->next_block).id);
  sVar3 = (pSVar9->dominated_variables).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
  if (sVar3 != 0) {
    pTVar4 = (pSVar9->dominated_variables).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
    lVar16 = 0;
    do {
      flush_variable_declaration(this,*(uint32_t *)((long)&pTVar4->id + lVar16));
      lVar16 = lVar16 + 4;
    } while (sVar3 << 2 != lVar16);
  }
  uVar1 = this->statement_count;
  bVar17 = this->block_debug_directives;
  this->block_debug_directives = true;
  emit_block_instructions(this,pSVar9);
  this->block_debug_directives = bVar17;
  uVar2 = (pSVar9->condition).id;
  uVar5 = (this->super_Compiler).forced_temporaries._M_h._M_bucket_count;
  uVar13 = (ulong)uVar2 % uVar5;
  p_Var14 = (this->super_Compiler).forced_temporaries._M_h._M_buckets[uVar13];
  p_Var15 = (__node_base_ptr)0x0;
  if ((p_Var14 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var14->_M_nxt, p_Var15 = p_Var14, uVar2 != *(uint *)&p_Var14->_M_nxt[1]._M_nxt)) {
    while (p_Var14 = p_Var6, p_Var6 = p_Var14->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var15 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var6[1]._M_nxt % uVar5 != uVar13) ||
         (p_Var15 = p_Var14, uVar2 == *(uint *)&p_Var6[1]._M_nxt)) goto LAB_00298663;
    }
    p_Var15 = (__node_base_ptr)0x0;
  }
LAB_00298663:
  if (p_Var15 == (__node_base_ptr)0x0) {
    bVar17 = false;
  }
  else {
    bVar17 = p_Var15->_M_nxt != (_Hash_node_base *)0x0;
  }
  bVar7 = Compiler::flush_phi_required
                    (&this->super_Compiler,(BlockID)(pSVar9->super_IVariant).self.id,
                     (BlockID)(pSVar9->true_block).id);
  if ((bVar7) ||
     (bVar7 = Compiler::flush_phi_required
                        (&this->super_Compiler,(BlockID)(pSVar9->super_IVariant).self.id,
                         (BlockID)(pSVar9->false_block).id),
     (bVar17 || bVar7) || uVar1 != this->statement_count)) {
LAB_00298828:
    block->disable_block_optimization = true;
    Compiler::force_recompile(&this->super_Compiler);
    statement<char_const(&)[2]>(this,(char (*) [2])0x2f5d0c);
    this->indent = this->indent + 1;
    return false;
  }
  to.id = (pSVar9->true_block).id;
  if (CVar8 == WhileLoop) {
    emit_while_loop_initializers(this,block);
    (*(this->super_Compiler)._vptr_Compiler[0x38])(this,block);
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
    to_expression_abi_cxx11_(&initializer,this,(pSVar9->condition).id,true);
    pCVar10 = (CompilerGLSL *)
              Variant::get<spirv_cross::SPIRBlock>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (pSVar9->true_block).id);
    pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (block->merge_block).id);
    bVar17 = Compiler::execution_is_noop(&this->super_Compiler,(SPIRBlock *)pCVar10,pSVar11);
    if (bVar17) {
      enclose_expression(&continue_block,pCVar10,&initializer);
      join<char_const(&)[2],std::__cxx11::string>
                (&condition,(spirv_cross *)0x3053c7,(char (*) [2])&continue_block,pbVar12);
      ::std::__cxx11::string::operator=((string *)&initializer,(string *)&condition);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)condition._M_dataplus._M_p != &condition.field_2) {
        operator_delete(condition._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)continue_block._M_dataplus._M_p != &continue_block.field_2) {
        operator_delete(continue_block._M_dataplus._M_p);
      }
      to.id = (pSVar9->false_block).id;
    }
    statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [8])"while (",&initializer,(char (*) [2])0x314a82);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)initializer._M_dataplus._M_p == &initializer.field_2) goto LAB_00298a8a;
  }
  else {
    if (CVar8 != ForLoop) goto LAB_00298828;
    emit_for_loop_initializers_abi_cxx11_(&initializer,this,block);
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
    to_expression_abi_cxx11_(&condition,this,(pSVar9->condition).id,true);
    pCVar10 = (CompilerGLSL *)
              Variant::get<spirv_cross::SPIRBlock>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (pSVar9->true_block).id);
    pSVar11 = Variant::get<spirv_cross::SPIRBlock>
                        ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                         (block->merge_block).id);
    bVar17 = Compiler::execution_is_noop(&this->super_Compiler,(SPIRBlock *)pCVar10,pSVar11);
    if (bVar17) {
      enclose_expression(&local_50,pCVar10,&condition);
      join<char_const(&)[2],std::__cxx11::string>
                (&continue_block,(spirv_cross *)0x3053c7,(char (*) [2])&local_50,pbVar12);
      ::std::__cxx11::string::operator=((string *)&condition,(string *)&continue_block);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)continue_block._M_dataplus._M_p != &continue_block.field_2) {
        operator_delete(continue_block._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      to.id = (pSVar9->false_block).id;
    }
    emit_continue_block_abi_cxx11_(&continue_block,this,(block->continue_block).id,false,false);
    (*(this->super_Compiler)._vptr_Compiler[0x38])(this,block);
    statement<char_const(&)[6],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [6])"for (",&initializer,(char (*) [3])0x2f514f,&condition,
               (char (*) [3])0x2f514f,&continue_block,(char (*) [2])0x314a82);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)continue_block._M_dataplus._M_p != &continue_block.field_2) {
      operator_delete(continue_block._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)condition._M_dataplus._M_p != &condition.field_2) {
      operator_delete(condition._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)initializer._M_dataplus._M_p == &initializer.field_2) goto LAB_00298a8a;
  }
  operator_delete(initializer._M_dataplus._M_p);
LAB_00298a8a:
  statement<char_const(&)[2]>(this,(char (*) [2])0x2f5d0c);
  this->indent = this->indent + 1;
  branch(this,(BlockID)(pSVar9->super_IVariant).self.id,to);
  return true;
}

Assistant:

bool CompilerGLSL::attempt_emit_loop_header(SPIRBlock &block, SPIRBlock::Method method)
{
	SPIRBlock::ContinueBlockType continue_type = continue_block_type(get<SPIRBlock>(block.continue_block));

	if (method == SPIRBlock::MergeToSelectForLoop || method == SPIRBlock::MergeToSelectContinueForLoop)
	{
		uint32_t current_count = statement_count;
		// If we're trying to create a true for loop,
		// we need to make sure that all opcodes before branch statement do not actually emit any code.
		// We can then take the condition expression and create a for (; cond ; ) { body; } structure instead.
		emit_block_instructions_with_masked_debug(block);

		bool condition_is_temporary = forced_temporaries.find(block.condition) == end(forced_temporaries);

		bool flushes_phi = flush_phi_required(block.self, block.true_block) ||
		                   flush_phi_required(block.self, block.false_block);

		// This can work! We only did trivial things which could be forwarded in block body!
		if (!flushes_phi && current_count == statement_count && condition_is_temporary)
		{
			switch (continue_type)
			{
			case SPIRBlock::ForLoop:
			{
				// This block may be a dominating block, so make sure we flush undeclared variables before building the for loop header.
				flush_undeclared_variables(block);

				// Important that we do this in this order because
				// emitting the continue block can invalidate the condition expression.
				auto initializer = emit_for_loop_initializers(block);
				auto condition = to_expression(block.condition);

				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(block.true_block), get<SPIRBlock>(block.merge_block)))
					condition = join("!", enclose_expression(condition));

				emit_block_hints(block);
				if (method != SPIRBlock::MergeToSelectContinueForLoop)
				{
					auto continue_block = emit_continue_block(block.continue_block, false, false);
					statement("for (", initializer, "; ", condition, "; ", continue_block, ")");
				}
				else
					statement("for (", initializer, "; ", condition, "; )");
				break;
			}

			case SPIRBlock::WhileLoop:
			{
				// This block may be a dominating block, so make sure we flush undeclared variables before building the while loop header.
				flush_undeclared_variables(block);
				emit_while_loop_initializers(block);
				emit_block_hints(block);

				auto condition = to_expression(block.condition);
				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(block.true_block), get<SPIRBlock>(block.merge_block)))
					condition = join("!", enclose_expression(condition));

				statement("while (", condition, ")");
				break;
			}

			default:
				block.disable_block_optimization = true;
				force_recompile();
				begin_scope(); // We'll see an end_scope() later.
				return false;
			}

			begin_scope();
			return true;
		}
		else
		{
			block.disable_block_optimization = true;
			force_recompile();
			begin_scope(); // We'll see an end_scope() later.
			return false;
		}
	}
	else if (method == SPIRBlock::MergeToDirectForLoop)
	{
		auto &child = get<SPIRBlock>(block.next_block);

		// This block may be a dominating block, so make sure we flush undeclared variables before building the for loop header.
		flush_undeclared_variables(child);

		uint32_t current_count = statement_count;

		// If we're trying to create a true for loop,
		// we need to make sure that all opcodes before branch statement do not actually emit any code.
		// We can then take the condition expression and create a for (; cond ; ) { body; } structure instead.
		emit_block_instructions_with_masked_debug(child);

		bool condition_is_temporary = forced_temporaries.find(child.condition) == end(forced_temporaries);

		bool flushes_phi = flush_phi_required(child.self, child.true_block) ||
		                   flush_phi_required(child.self, child.false_block);

		if (!flushes_phi && current_count == statement_count && condition_is_temporary)
		{
			uint32_t target_block = child.true_block;

			switch (continue_type)
			{
			case SPIRBlock::ForLoop:
			{
				// Important that we do this in this order because
				// emitting the continue block can invalidate the condition expression.
				auto initializer = emit_for_loop_initializers(block);
				auto condition = to_expression(child.condition);

				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(child.true_block), get<SPIRBlock>(block.merge_block)))
				{
					condition = join("!", enclose_expression(condition));
					target_block = child.false_block;
				}

				auto continue_block = emit_continue_block(block.continue_block, false, false);
				emit_block_hints(block);
				statement("for (", initializer, "; ", condition, "; ", continue_block, ")");
				break;
			}

			case SPIRBlock::WhileLoop:
			{
				emit_while_loop_initializers(block);
				emit_block_hints(block);

				auto condition = to_expression(child.condition);
				// Condition might have to be inverted.
				if (execution_is_noop(get<SPIRBlock>(child.true_block), get<SPIRBlock>(block.merge_block)))
				{
					condition = join("!", enclose_expression(condition));
					target_block = child.false_block;
				}

				statement("while (", condition, ")");
				break;
			}

			default:
				block.disable_block_optimization = true;
				force_recompile();
				begin_scope(); // We'll see an end_scope() later.
				return false;
			}

			begin_scope();
			branch(child.self, target_block);
			return true;
		}
		else
		{
			block.disable_block_optimization = true;
			force_recompile();
			begin_scope(); // We'll see an end_scope() later.
			return false;
		}
	}
	else
		return false;
}